

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,string *make,
          string *makeArgs,string *path,char *homeOutputDir)

{
  ostream *poVar1;
  char *local_50;
  string *path_local;
  string *makeArgs_local;
  string *make_local;
  string *target_local;
  cmGeneratedFileStream *fout_local;
  cmExtraKateGenerator *this_local;
  
  poVar1 = std::operator<<((ostream *)fout,"\t\t\t");
  poVar1 = std::operator<<(poVar1,AppendTarget::JsonSep);
  poVar1 = std::operator<<(poVar1,"{\"name\":\"");
  poVar1 = std::operator<<(poVar1,(string *)target);
  poVar1 = std::operator<<(poVar1,"\", \"build_cmd\":\"");
  poVar1 = std::operator<<(poVar1,(string *)make);
  poVar1 = std::operator<<(poVar1," -C \\\"");
  if ((this->UseNinja & 1U) == 0) {
    local_50 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_50 = homeOutputDir;
  }
  poVar1 = std::operator<<(poVar1,local_50);
  poVar1 = std::operator<<(poVar1,"\\\" ");
  poVar1 = std::operator<<(poVar1,(string *)makeArgs);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)target);
  std::operator<<(poVar1,"\"}\n");
  AppendTarget::JsonSep = ',';
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                        const std::string& target,
                                        const std::string& make,
                                        const std::string& makeArgs,
                                        const std::string& path,
                                        const char* homeOutputDir) const
{
  static char JsonSep = ' ';

  fout << "\t\t\t" << JsonSep << "{\"name\":\"" << target << "\", "
                                                             "\"build_cmd\":\""
       << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path.c_str())
       << "\\\" " << makeArgs << " " << target << "\"}\n";

  JsonSep = ',';
}